

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar7;
  ulong uVar4;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar9;
  undefined1 auVar10 [16];
  char cVar11;
  int iVar12;
  pointer pOVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int left;
  float fVar19;
  float fVar20;
  int top;
  __m128 t_2;
  undefined1 auVar21 [16];
  float fVar23;
  undefined1 auVar22 [16];
  int iVar24;
  __m128 t;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vector<Object,_std::allocator<Object>_> objects8;
  allocator local_379;
  vector<Object,_std::allocator<Object>_> proposals;
  int baseLine;
  Extractor ex;
  Mat anchors;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  Mat in_pad;
  Mat out;
  int local_208;
  int iStack_204;
  Mat in;
  Mat m;
  undefined8 local_190;
  uchar *local_188;
  Net yolov5;
  
  if (argc == 2) {
    pcVar9 = argv[1];
    std::__cxx11::string::string((string *)&yolov5,pcVar9,(allocator *)&in);
    cv::imread((string *)&m,(int)&yolov5);
    std::__cxx11::string::~string((string *)&yolov5);
    cVar11 = cv::Mat::empty();
    if (cVar11 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov5);
      yolov5.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&yolov5,"yolov5s_6.0.param");
      ncnn::Net::load_model(&yolov5,"yolov5s_6.0.bin");
      local_208 = (int)local_190;
      iStack_204 = (int)((ulong)local_190 >> 0x20);
      if (local_208 < iStack_204) {
        local_2f8._4_4_ = 640.0 / (float)iStack_204;
        iVar12 = (int)((float)local_208 * (float)local_2f8._4_4_);
        iVar24 = 0x280;
      }
      else {
        local_2f8._4_4_ = 640.0 / (float)local_208;
        iVar24 = (int)((float)iStack_204 * (float)local_2f8._4_4_);
        iVar12 = 0x280;
      }
      ncnn::Mat::from_pixels_resize
                (&in,local_188,0x10002,iStack_204,local_208,iVar24,iVar12,(Allocator *)0x0);
      in_pad.cstep = 0;
      in_pad.data._0_4_ = 0;
      in_pad.data._4_4_ = 0;
      in_pad.refcount._0_4_ = 0;
      in_pad.refcount._4_4_ = 0;
      in_pad.elemsize = 0;
      in_pad.elempack = 0;
      in_pad._32_12_ = SUB1612((undefined1  [16])0x0,0);
      in_pad.w = 0;
      in_pad._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&out);
      iVar24 = ((iVar24 + 0x3f) / 0x40) * 0x40 - iVar24;
      iVar12 = ((iVar12 + 0x3f) / 0x40) * 0x40 - iVar12;
      left = iVar24 / 2;
      top = iVar12 / 2;
      ncnn::copy_make_border(&in,&in_pad,top,iVar12 - top,left,iVar24 - left,0,114.0,(Option *)&out)
      ;
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&in_pad,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"images",&in_pad);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize = 0;
      out.elempack = 0;
      out._32_12_ = SUB1612((undefined1  [16])0x0,0);
      out.w = 0;
      out._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"output",&out,0);
      ncnn::Mat::Mat(&anchors,6,4,(Allocator *)0x0);
      *(undefined8 *)anchors.data = 0x4150000041200000;
      *(undefined8 *)((long)anchors.data + 8) = 0x41f0000041800000;
      *(undefined8 *)((long)anchors.data + 0x10) = 0x41b8000042040000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&anchors,8,&in_pad,&out,0.0,&objects8);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      ncnn::Mat::~Mat(&anchors);
      ncnn::Mat::~Mat(&out);
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize = 0;
      out.elempack = 0;
      out._32_12_ = SUB1612((undefined1  [16])0x0,0);
      out.w = 0;
      out._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"376",&out,0);
      ncnn::Mat::Mat(&anchors,6,4,(Allocator *)0x0);
      *(undefined8 *)anchors.data = 0x4274000041f00000;
      *(undefined8 *)((long)anchors.data + 8) = 0x4234000042780000;
      *(undefined8 *)((long)anchors.data + 0x10) = 0x42ee0000426c0000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&anchors,0x10,&in_pad,&out,0.0,&objects8);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      ncnn::Mat::~Mat(&anchors);
      ncnn::Mat::~Mat(&out);
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize = 0;
      out.elempack = 0;
      out._32_12_ = SUB1612((undefined1  [16])0x0,0);
      out.w = 0;
      out._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"401",&out,0);
      ncnn::Mat::Mat(&anchors,6,4,(Allocator *)0x0);
      *(undefined8 *)anchors.data = 0x42b4000042e80000;
      *(undefined8 *)((long)anchors.data + 8) = 0x43460000431c0000;
      *(undefined8 *)((long)anchors.data + 0x10) = 0x43a3000043ba8000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&anchors,0x20,&in_pad,&out,0.0,&objects8);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      ncnn::Mat::~Mat(&anchors);
      ncnn::Mat::~Mat(&out);
      pOVar13 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)(((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                               .super__Vector_impl_data._M_start) / 0x18) + -1);
        pOVar13 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      anchors.data = (void *)0x0;
      anchors.refcount = (int *)0x0;
      anchors.elemsize = 0;
      uVar14 = ((long)pOVar13 -
               (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      iVar24 = (int)uVar14;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&out,(long)iVar24,
                 (allocator_type *)&objects8);
      uVar16 = 0;
      uVar18 = 0;
      if (0 < iVar24) {
        uVar18 = uVar14 & 0xffffffff;
      }
      pfVar15 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start)->rect).height;
      for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
        *(float *)((long)out.data + uVar16 * 4) = pfVar15[-1] * *pfVar15;
        pfVar15 = pfVar15 + 6;
      }
      iVar12 = 0;
      while( true ) {
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = (float)iVar12;
        if (iVar24 <= iVar12) break;
        pOVar13 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar12;
        uVar16 = (ulong)((long)anchors.refcount - (long)anchors.data) >> 2;
        uVar14 = uVar16 & 0xffffffff;
        if ((int)uVar16 < 1) {
          uVar14 = 0;
        }
        uVar16 = 1;
        for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
          lVar17 = (long)*(int *)((long)anchors.data + uVar18 * 4);
          uVar3._0_4_ = (pOVar13->rect).x;
          uVar3._4_4_ = (pOVar13->rect).y;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar3;
          uVar1 = (pOVar13->rect).width;
          uVar7 = (pOVar13->rect).height;
          uVar4._0_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar17].rect.x;
          uVar4._4_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar17].rect.y;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar4;
          uVar2 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar17].rect.width;
          uVar8 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar17].rect.height;
          auVar21._0_4_ = (float)uVar2 + (float)(undefined4)uVar4;
          auVar21._4_4_ = (float)uVar8 + (float)uVar4._4_4_;
          auVar21._8_8_ = 0;
          auVar28 = maxps(auVar27,auVar28);
          auVar26._0_4_ = (float)uVar1 + (float)(undefined4)uVar3;
          auVar26._4_4_ = (float)uVar7 + (float)uVar3._4_4_;
          auVar26._8_8_ = 0;
          auVar21 = minps(auVar21,auVar26);
          fVar19 = auVar21._0_4_ - auVar28._0_4_;
          fVar23 = auVar21._4_4_ - auVar28._4_4_;
          fVar20 = 0.0;
          if (0.0 < fVar23 && 0.0 < fVar19) {
            fVar20 = fVar19 * fVar23;
          }
          if (0.45 < fVar20 / ((*(float *)((long)out.data + (long)iVar12 * 4) +
                               *(float *)((long)out.data + lVar17 * 4)) - fVar20)) {
            uVar16 = 0;
          }
        }
        if ((int)uVar16 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&anchors,(value_type_conflict1 *)&objects8
                    );
          iVar12 = (int)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_;
        }
        iVar12 = iVar12 + 1;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&out);
      uVar14 = (ulong)((long)anchors.refcount - (long)anchors.data) >> 2;
      iVar24 = (int)uVar14;
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)iVar24);
      uVar16 = 0;
      uVar14 = uVar14 & 0xffffffff;
      if (iVar24 < 1) {
        uVar14 = uVar16;
      }
      local_2f8._0_4_ = local_2f8._4_4_;
      fStack_2f0 = (float)local_2f8._4_4_;
      fStack_2ec = (float)local_2f8._4_4_;
      lVar17 = 8;
      for (; uVar14 != uVar16; uVar16 = uVar16 + 1) {
        Object::operator=((Object *)
                          ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar17 + -8),
                          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          *(int *)((long)anchors.data + uVar16 * 4));
        uVar5 = *(undefined8 *)
                 ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17 + -8);
        uVar6 = *(undefined8 *)
                 ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start)->rect).x + lVar17);
        fVar19 = (float)uVar5;
        fVar20 = (float)((ulong)uVar5 >> 0x20);
        auVar22._0_4_ = fVar19 - (float)left;
        auVar22._4_4_ = fVar20 - (float)top;
        auVar22._8_8_ = 0;
        auVar21 = divps(auVar22,_local_2f8);
        auVar25._0_4_ = ((float)uVar6 + fVar19) - (float)left;
        auVar25._4_4_ = ((float)((ulong)uVar6 >> 0x20) + fVar20) - (float)top;
        auVar25._8_8_ = 0;
        auVar28 = divps(auVar25,_local_2f8);
        auVar10._4_4_ = (float)(local_208 + -1);
        auVar10._0_4_ = (float)(iStack_204 + -1);
        auVar10._8_4_ = 0xbf800000;
        auVar10._12_4_ = 0xbf800000;
        auVar21 = minps(auVar10,auVar21);
        auVar21 = maxps(ZEXT816(0),auVar21);
        auVar28 = minps(auVar10,auVar28);
        auVar28 = maxps(ZEXT816(0),auVar28);
        *(long *)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17 + -8) = auVar21._0_8_;
        *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start)->rect).x + lVar17) =
             CONCAT44(auVar28._4_4_ - auVar21._4_4_,auVar28._0_4_ - auVar21._0_4_);
        lVar17 = lVar17 + 0x18;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&anchors);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&proposals.super__Vector_base<Object,_std::allocator<Object>_>);
      ncnn::Extractor::~Extractor(&ex);
      ncnn::Mat::~Mat(&in_pad);
      ncnn::Mat::~Mat(&in);
      ncnn::Net::~Net(&yolov5);
      cv::Mat::clone();
      lVar17 = 0;
      uVar14 = 0;
      while( true ) {
        pOVar13 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_pad.refcount = (int *)&in;
        if ((ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18) <= uVar14) break;
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                (double)*(float *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->prob + lVar17)
                ,(double)*(float *)((long)&((objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                   lVar17),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar17),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar17),
                SUB84((double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                height + lVar17),0),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar17)
               );
        in_pad.elemsize = 0;
        in_pad.data._0_4_ = 0x3010000;
        pfVar15 = (float *)((long)&(pOVar13->rect).x + lVar17);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = (int)ROUND(pfVar15[1]);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (int)ROUND(*pfVar15);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = (int)ROUND(pfVar15[2]);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = (int)ROUND(pfVar15[3]);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&yolov5);
        yolov5._vptr_Net = (_func_int **)0x406fe00000000000;
        yolov5.opt.lightmode = false;
        yolov5.opt._1_3_ = 0;
        yolov5.opt.num_threads = 0;
        yolov5.opt.blob_allocator = (Allocator *)0x0;
        yolov5.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle(&in_pad,&proposals,&yolov5,1,8,0);
        sprintf((char *)&yolov5,"%s %.1f%%",
                (double)(*(float *)((long)&pOVar13->prob + lVar17) * 100.0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                        + (long)*(int *)((long)&pOVar13->label + lVar17) * 4));
        std::__cxx11::string::string((string *)&in_pad,(char *)&yolov5,(allocator *)&anchors);
        cv::getTextSize((string *)&ex,(int)&in_pad,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)&in_pad);
        fVar19 = (float)(int)*(float *)((long)&(pOVar13->rect).x + lVar17);
        iVar24 = (int)((*(float *)((long)&(pOVar13->rect).y + lVar17) -
                       (float)ex._vptr_Extractor._4_4_) - 0.0);
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        fVar20 = (float)(in.refcount._4_4_ - (int)ex._vptr_Extractor);
        if ((int)ex._vptr_Extractor + (int)fVar19 <= in.refcount._4_4_) {
          fVar20 = fVar19;
        }
        anchors.elemsize = 0;
        anchors.data._0_4_ = 0x3010000;
        anchors.refcount = (int *)&in;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._4_4_ = iVar24;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = fVar20;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._0_4_ = (int)ex._vptr_Extractor;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._4_4_ = ex._vptr_Extractor._4_4_;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&in_pad);
        in_pad.data._0_4_ = 0;
        in_pad.data._4_4_ = 0x406fe000;
        in_pad.refcount._0_4_ = 0;
        in_pad.refcount._4_4_ = 0x406fe000;
        in_pad.elemsize = 0x406fe00000000000;
        in_pad.elempack = 0;
        in_pad._28_4_ = 0;
        cv::rectangle(&anchors,&objects8,&in_pad,0xffffffffffffffff,8,0);
        anchors.elemsize = 0;
        anchors.data._0_4_ = 0x3010000;
        std::__cxx11::string::string((string *)&in_pad,(char *)&yolov5,&local_379);
        norm_vals[1] = (float)(iVar24 + ex._vptr_Extractor._4_4_);
        norm_vals[0] = fVar20;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&out);
        out.elemsize = 0;
        out.elempack = 0;
        out._28_4_ = 0;
        out.data = (void *)0x0;
        out.refcount._0_4_ = 0;
        out.refcount._4_4_ = 0;
        cv::putText(0x3fe0000000000000,&anchors,&in_pad,norm_vals,0,&out,1,8,0);
        std::__cxx11::string::~string((string *)&in_pad);
        uVar14 = uVar14 + 1;
        lVar17 = lVar17 + 0x18;
      }
      std::__cxx11::string::string((string *)&yolov5,"image",(allocator *)&anchors);
      in_pad.elemsize = 0;
      in_pad.data._0_4_ = 0x1010000;
      cv::imshow((string *)&yolov5,(_InputArray *)&in_pad);
      std::__cxx11::string::~string((string *)&yolov5);
      iVar24 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&in);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar9);
      iVar24 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar24 = -1;
  }
  return iVar24;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov5(m, objects);

    draw_objects(m, objects);

    return 0;
}